

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::date_t,duckdb::timestamp_t,duckdb::BinaryStandardOperatorWrapper,duckdb::DateTruncBinaryOperator,bool,false,false>
               (string_t *ldata,date_t *rdata,timestamp_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  timestamp_t tVar2;
  timestamp_t *ptVar3;
  timestamp_t *ptVar4;
  idx_t iVar5;
  ulong uVar6;
  char **ppcVar7;
  idx_t iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  string_t specifier;
  string_t specifier_00;
  string_t specifier_01;
  char **local_70;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      local_70 = &(ldata->value).pointer.ptr;
      iVar8 = 0;
      iVar5 = count;
      do {
        specifier_01.value._8_4_ = rdata[iVar8].days;
        specifier_01.value._0_8_ = *local_70;
        specifier_01.value._12_4_ = 0;
        tVar2 = DateTruncBinaryOperator::
                Operation<duckdb::string_t,duckdb::date_t,duckdb::timestamp_t>
                          (*(DateTruncBinaryOperator **)(local_70 + -1),specifier_01,
                           (date_t)(int32_t)iVar5);
        result_data[iVar8].value = tVar2.value;
        iVar8 = iVar8 + 1;
        local_70 = local_70 + 2;
      } while (count != iVar8);
    }
  }
  else if (0x3f < count + 0x3f) {
    ptVar3 = (timestamp_t *)0x0;
    uVar11 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar6 = 0xffffffffffffffff;
      }
      else {
        uVar6 = puVar1[(long)ptVar3];
      }
      uVar10 = uVar11 + 0x40;
      if (count <= uVar11 + 0x40) {
        uVar10 = count;
      }
      uVar9 = uVar10;
      if (uVar6 != 0) {
        uVar9 = uVar11;
        if (uVar6 == 0xffffffffffffffff) {
          if (uVar11 < uVar10) {
            ppcVar7 = &ldata[uVar11].value.pointer.ptr;
            ptVar4 = ptVar3;
            do {
              specifier.value._8_4_ = rdata[uVar11].days;
              specifier.value._0_8_ = *ppcVar7;
              specifier.value._12_4_ = 0;
              tVar2 = DateTruncBinaryOperator::
                      Operation<duckdb::string_t,duckdb::date_t,duckdb::timestamp_t>
                                (*(DateTruncBinaryOperator **)(ppcVar7 + -1),specifier,
                                 (date_t)(int32_t)ptVar4);
              result_data[uVar11].value = tVar2.value;
              uVar11 = uVar11 + 1;
              ppcVar7 = ppcVar7 + 2;
              uVar9 = uVar11;
            } while (uVar10 != uVar11);
          }
        }
        else if (uVar11 < uVar10) {
          ppcVar7 = &ldata[uVar11].value.pointer.ptr;
          uVar9 = 0;
          ptVar4 = ptVar3;
          do {
            if ((uVar6 >> (uVar9 & 0x3f) & 1) != 0) {
              specifier_00.value._8_4_ = rdata[uVar11 + uVar9].days;
              specifier_00.value._0_8_ = *ppcVar7;
              specifier_00.value._12_4_ = 0;
              tVar2 = DateTruncBinaryOperator::
                      Operation<duckdb::string_t,duckdb::date_t,duckdb::timestamp_t>
                                (*(DateTruncBinaryOperator **)(ppcVar7 + -1),specifier_00,
                                 (date_t)(int32_t)ptVar4);
              (result_data + uVar11)[uVar9].value = tVar2.value;
              ptVar4 = result_data + uVar11;
            }
            uVar9 = uVar9 + 1;
            ppcVar7 = ppcVar7 + 2;
          } while ((uVar11 - uVar10) + uVar9 != 0);
          uVar9 = uVar11 + uVar9;
        }
      }
      ptVar3 = (timestamp_t *)((long)&ptVar3->value + 1);
      uVar11 = uVar9;
    } while (ptVar3 != (timestamp_t *)(count + 0x3f >> 6));
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}